

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O3

MRIStepCoupling MRIStepCoupling_Alloc(int nmat,int stages,MRISTEP_METHOD_TYPE type)

{
  ulong __nmemb;
  MRIStepCoupling MRIC;
  realtype *prVar1;
  realtype ***ppprVar2;
  realtype **pprVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __nmemb_00;
  
  if (stages < 1 || nmat < 1) {
    return (MRIStepCoupling)0x0;
  }
  __nmemb = (ulong)(uint)nmat;
  MRIC = (MRIStepCoupling)malloc(0x28);
  if (MRIC == (MRIStepCoupling)0x0) {
    return (MRIStepCoupling)0x0;
  }
  MRIC->nmat = nmat;
  MRIC->stages = stages;
  __nmemb_00 = (ulong)(uint)stages;
  prVar1 = (realtype *)calloc(__nmemb_00,8);
  MRIC->q = 0;
  MRIC->p = 0;
  MRIC->c = (realtype *)0x0;
  MRIC->W = (realtype ***)0x0;
  MRIC->G = (realtype ***)0x0;
  MRIC->c = prVar1;
  if (prVar1 != (realtype *)0x0) {
    if ((type & ~MRISTEP_IMEX) == MRISTEP_EXPLICIT) {
      ppprVar2 = (realtype ***)calloc(__nmemb,8);
      MRIC->W = ppprVar2;
      if (ppprVar2 == (realtype ***)0x0) goto LAB_003fc678;
      uVar4 = 0;
      do {
        ppprVar2[uVar4] = (realtype **)0x0;
        pprVar3 = (realtype **)calloc(__nmemb_00,8);
        MRIC->W[uVar4] = pprVar3;
        ppprVar2 = MRIC->W;
        if (ppprVar2[uVar4] == (realtype **)0x0) goto LAB_003fc678;
        uVar4 = uVar4 + 1;
      } while (__nmemb != uVar4);
      uVar4 = 0;
      do {
        pprVar3 = ppprVar2[uVar4];
        uVar5 = 0;
        do {
          pprVar3[uVar5] = (realtype *)0x0;
          prVar1 = (realtype *)calloc(__nmemb_00,8);
          MRIC->W[uVar4][uVar5] = prVar1;
          ppprVar2 = MRIC->W;
          pprVar3 = ppprVar2[uVar4];
          if (pprVar3[uVar5] == (realtype *)0x0) goto LAB_003fc678;
          uVar5 = uVar5 + 1;
        } while (__nmemb_00 != uVar5);
        uVar4 = uVar4 + 1;
      } while (uVar4 != __nmemb);
    }
    if (1 < type - MRISTEP_IMPLICIT) {
      return MRIC;
    }
    ppprVar2 = (realtype ***)calloc(__nmemb,8);
    MRIC->G = ppprVar2;
    if (ppprVar2 != (realtype ***)0x0) {
      uVar4 = 0;
      while( true ) {
        ppprVar2[uVar4] = (realtype **)0x0;
        pprVar3 = (realtype **)calloc(__nmemb_00,8);
        MRIC->G[uVar4] = pprVar3;
        ppprVar2 = MRIC->G;
        if (ppprVar2[uVar4] == (realtype **)0x0) break;
        uVar4 = uVar4 + 1;
        if (__nmemb == uVar4) {
          uVar4 = 0;
          do {
            pprVar3 = ppprVar2[uVar4];
            uVar5 = 0;
            do {
              pprVar3[uVar5] = (realtype *)0x0;
              prVar1 = (realtype *)calloc(__nmemb_00,8);
              MRIC->G[uVar4][uVar5] = prVar1;
              ppprVar2 = MRIC->G;
              pprVar3 = ppprVar2[uVar4];
              if (pprVar3[uVar5] == (realtype *)0x0) goto LAB_003fc678;
              uVar5 = uVar5 + 1;
            } while (__nmemb_00 != uVar5);
            uVar4 = uVar4 + 1;
            if (uVar4 == __nmemb) {
              return MRIC;
            }
          } while( true );
        }
      }
    }
  }
LAB_003fc678:
  MRIStepCoupling_Free(MRIC);
  return (MRIStepCoupling)0x0;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Alloc(int nmat, int stages,
                                      MRISTEP_METHOD_TYPE type)
{
  int i, j;
  MRIStepCoupling MRIC = NULL;

  /* Check for legal input values */
  if (nmat < 1 || stages < 1) return(NULL);

  /* ------------------------------------------
   * Allocate and initialize coupling structure
   * ------------------------------------------ */

  MRIC = (MRIStepCoupling) malloc(sizeof(struct MRIStepCouplingMem));
  if (!MRIC) return(NULL);

  MRIC->nmat   = nmat;
  MRIC->stages = stages;
  MRIC->q      = 0;
  MRIC->p      = 0;
  MRIC->c      = NULL;
  MRIC->W      = NULL;
  MRIC->G      = NULL;

  /* --------------------------------------------
   * Allocate abscissae and coupling coefficients
   * -------------------------------------------- */

  MRIC->c = (realtype *) calloc( stages, sizeof(realtype) );
  if (!(MRIC->c)) { MRIStepCoupling_Free(MRIC); return(NULL); }

  if (type == MRISTEP_EXPLICIT || type == MRISTEP_IMEX) {

    /* allocate W matrices */
    MRIC->W = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->W)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in W */
    for (i=0; i<nmat; i++) {
      MRIC->W[i] = NULL;
      MRIC->W[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->W[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in W */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->W[i][j] = NULL;
        MRIC->W[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->W[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  if (type == MRISTEP_IMPLICIT || type == MRISTEP_IMEX) {

    /* allocate G matrices */
    MRIC->G = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->G)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in G */
    for (i=0; i<nmat; i++) {
      MRIC->G[i] = NULL;
      MRIC->G[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->G[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in G */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->G[i][j] = NULL;
        MRIC->G[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->G[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  return(MRIC);
}